

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

int __thiscall World::GeneratePlayerID(World *this)

{
  bool bVar1;
  list<Client_*,_std::allocator<Client_*>_> *this_00;
  reference ppCVar2;
  EOClient *eoclient;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  uint lowest_free_id;
  World *this_local;
  
  __range1._4_4_ = 1;
  do {
    this_00 = &(this->server->super_Server).clients;
    __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_00);
    client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&client);
      if (!bVar1) {
        return __range1._4_4_;
      }
      ppCVar2 = std::_List_iterator<Client_*>::operator*(&__end1);
      if ((int)(*ppCVar2)[1].send_buffer._M_string_length == __range1._4_4_) break;
      std::_List_iterator<Client_*>::operator++(&__end1);
    }
    __range1._4_4_ = (int)(*ppCVar2)[1].send_buffer._M_string_length + 1;
  } while( true );
}

Assistant:

int World::GeneratePlayerID()
{
	unsigned int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->id == lowest_free_id)
		{
			lowest_free_id = eoclient->id + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}